

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils-inl.hpp
# Opt level: O2

void CoreMLConverter::unsupportedCaffeParrameter
               (string *parameterName,string *layerName,string *layerType)

{
  ostream *poVar1;
  runtime_error *this;
  string asStack_1c8 [32];
  stringstream ss;
  ostream local_198 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar1 = std::operator<<(local_198,"Unsupported parameter \'");
  poVar1 = std::operator<<(poVar1,(string *)parameterName);
  poVar1 = std::operator<<(poVar1,"\' in caffe layer \'");
  poVar1 = std::operator<<(poVar1,(string *)layerName);
  poVar1 = std::operator<<(poVar1,"\' of type \'");
  poVar1 = std::operator<<(poVar1,(string *)layerType);
  poVar1 = std::operator<<(poVar1,"\'.");
  std::endl<char,std::char_traits<char>>(poVar1);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this,asStack_1c8);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline void unsupportedCaffeParrameter(const std::string& parameterName,
                                    const std::string& layerName,
                                    const std::string& layerType) {
        
        std::stringstream ss;
        ss << "Unsupported parameter '" << parameterName << "' in caffe layer '"
           << layerName  << "' of type '"<< layerType << "'." << std::endl;
        throw std::runtime_error(ss.str());
    }